

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O3

Mat * ncnn::Mat::from_pixels
                (Mat *__return_storage_ptr__,uchar *pixels,int type,int w,int h,int stride,
                Allocator *allocator)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  void *pvVar5;
  float *pfVar6;
  long lVar7;
  float *pfVar8;
  void *pvVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  float *pfVar14;
  float *pfVar15;
  void *pvVar16;
  void *pvVar17;
  byte *pbVar18;
  int iVar19;
  int iVar22;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  Mat local_70;
  
  *(undefined8 *)((long)&__return_storage_ptr__->refcount + 4) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->elemsize + 4) = 0;
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->refcount = (int *)0x0;
  __return_storage_ptr__->allocator = (Allocator *)0x0;
  __return_storage_ptr__->dims = 0;
  __return_storage_ptr__->w = 0;
  __return_storage_ptr__->h = 0;
  __return_storage_ptr__->c = 0;
  __return_storage_ptr__->cstep = 0;
  if ((uint)type < 0x10000) {
    if (type - 1U < 2) {
      from_rgb(pixels,w,h,stride,__return_storage_ptr__,allocator);
    }
    else if (type == 3) {
      create(__return_storage_ptr__,w,h,1,4,allocator);
      pfVar6 = (float *)__return_storage_ptr__->data;
      if (pfVar6 == (float *)0x0) {
        return __return_storage_ptr__;
      }
      if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
        return __return_storage_ptr__;
      }
      iVar11 = 1;
      iVar22 = h;
      if (stride - w == 0) {
        iVar11 = h;
        iVar22 = 1;
      }
      if (iVar22 < 1) {
        return __return_storage_ptr__;
      }
      iVar19 = 0;
      pbVar18 = pixels;
      do {
        uVar12 = iVar11 * w + 1;
        if (0 < iVar11 * w) {
          do {
            *pfVar6 = (float)*pbVar18;
            pbVar18 = pbVar18 + 1;
            pfVar6 = pfVar6 + 1;
            uVar12 = uVar12 - 1;
          } while (1 < uVar12);
        }
        pbVar18 = pbVar18 + (stride - w);
        iVar19 = iVar19 + 1;
      } while (iVar19 != iVar22);
    }
    if ((type & 0xfffeU) != 4) {
      return __return_storage_ptr__;
    }
    create(__return_storage_ptr__,w,h,4,4,allocator);
    pfVar6 = (float *)__return_storage_ptr__->data;
    if (pfVar6 == (float *)0x0) {
      return __return_storage_ptr__;
    }
    if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
      return __return_storage_ptr__;
    }
    iVar11 = stride + w * -4;
    iVar22 = 1;
    if (iVar11 == 0) {
      iVar22 = h;
      h = 1;
    }
    if (h < 1) {
      return __return_storage_ptr__;
    }
    lVar7 = __return_storage_ptr__->cstep * __return_storage_ptr__->elemsize;
    pfVar14 = (float *)(lVar7 * 3 + (long)pfVar6);
    pfVar15 = (float *)((long)pfVar6 + lVar7 * 2);
    pfVar8 = (float *)(lVar7 + (long)pfVar6);
    iVar19 = 0;
    do {
      uVar12 = iVar22 * w + 1;
      if (0 < iVar22 * w) {
        do {
          *pfVar6 = (float)*pixels;
          *pfVar8 = (float)pixels[1];
          *pfVar15 = (float)pixels[2];
          *pfVar14 = (float)pixels[3];
          pixels = pixels + 4;
          pfVar6 = pfVar6 + 1;
          pfVar8 = pfVar8 + 1;
          pfVar15 = pfVar15 + 1;
          pfVar14 = pfVar14 + 1;
          uVar12 = uVar12 - 1;
        } while (1 < uVar12);
      }
      pixels = pixels + iVar11;
      iVar19 = iVar19 + 1;
    } while (iVar19 != h);
    return __return_storage_ptr__;
  }
  if (type < 0x30001) {
    switch(type) {
    case 0x10002:
switchD_001267e8_caseD_20001:
      from_rgb2bgr(pixels,w,h,stride,__return_storage_ptr__,allocator);
      return __return_storage_ptr__;
    case 0x10003:
switchD_001267e8_caseD_20003:
      from_gray2rgb(pixels,w,h,stride,__return_storage_ptr__,allocator);
      return __return_storage_ptr__;
    case 0x10004:
switchD_001267e8_caseD_20005:
      create(__return_storage_ptr__,w,h,3,4,allocator);
      pfVar6 = (float *)__return_storage_ptr__->data;
      if (pfVar6 == (float *)0x0) {
        return __return_storage_ptr__;
      }
      if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
        return __return_storage_ptr__;
      }
      iVar11 = stride + w * -4;
      iVar22 = 1;
      if (iVar11 == 0) {
        iVar22 = h;
        h = 1;
      }
      if (h < 1) {
        return __return_storage_ptr__;
      }
      lVar7 = __return_storage_ptr__->cstep * __return_storage_ptr__->elemsize;
      pfVar15 = (float *)((long)pfVar6 + lVar7 * 2);
      pfVar8 = (float *)(lVar7 + (long)pfVar6);
      iVar19 = 0;
      do {
        uVar12 = iVar22 * w + 1;
        if (0 < iVar22 * w) {
          do {
            *pfVar6 = (float)*pixels;
            *pfVar8 = (float)pixels[1];
            *pfVar15 = (float)pixels[2];
            pixels = pixels + 4;
            pfVar6 = pfVar6 + 1;
            pfVar8 = pfVar8 + 1;
            pfVar15 = pfVar15 + 1;
            uVar12 = uVar12 - 1;
          } while (1 < uVar12);
        }
        pixels = pixels + iVar11;
        iVar19 = iVar19 + 1;
      } while (iVar19 != h);
      return __return_storage_ptr__;
    case 0x10005:
switchD_001267e8_caseD_20004:
      create(__return_storage_ptr__,w,h,3,4,allocator);
      pfVar6 = (float *)__return_storage_ptr__->data;
      if (pfVar6 == (float *)0x0) {
        return __return_storage_ptr__;
      }
      if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
        return __return_storage_ptr__;
      }
      iVar11 = stride + w * -4;
      iVar22 = 1;
      if (iVar11 == 0) {
        iVar22 = h;
        h = 1;
      }
      if (h < 1) {
        return __return_storage_ptr__;
      }
      lVar7 = __return_storage_ptr__->cstep * __return_storage_ptr__->elemsize;
      pfVar15 = (float *)((long)pfVar6 + lVar7 * 2);
      pfVar8 = (float *)(lVar7 + (long)pfVar6);
      iVar19 = 0;
      do {
        uVar12 = iVar22 * w + 1;
        if (0 < iVar22 * w) {
          do {
            *pfVar6 = (float)pixels[2];
            *pfVar8 = (float)pixels[1];
            *pfVar15 = (float)*pixels;
            pixels = pixels + 4;
            pfVar6 = pfVar6 + 1;
            pfVar8 = pfVar8 + 1;
            pfVar15 = pfVar15 + 1;
            uVar12 = uVar12 - 1;
          } while (1 < uVar12);
        }
        pixels = pixels + iVar11;
        iVar19 = iVar19 + 1;
      } while (iVar19 != h);
      return __return_storage_ptr__;
    default:
      switch(type) {
      case 0x20001:
        goto switchD_001267e8_caseD_20001;
      default:
        return __return_storage_ptr__;
      case 0x20003:
        goto switchD_001267e8_caseD_20003;
      case 0x20004:
        goto switchD_001267e8_caseD_20004;
      case 0x20005:
        goto switchD_001267e8_caseD_20005;
      }
    }
  }
  switch(type) {
  case 0x30001:
    create(__return_storage_ptr__,w,h,1,4,allocator);
    pfVar6 = (float *)__return_storage_ptr__->data;
    if (pfVar6 == (float *)0x0) {
      return __return_storage_ptr__;
    }
    if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
      return __return_storage_ptr__;
    }
    iVar11 = stride + w * -3;
    iVar22 = 1;
    if (iVar11 == 0) {
      iVar22 = h;
      h = 1;
    }
    if (h < 1) {
      return __return_storage_ptr__;
    }
    iVar19 = 0;
    do {
      uVar12 = iVar22 * w + 1;
      if (0 < iVar22 * w) {
        do {
          bVar1 = pixels[2];
          *pfVar6 = (float)((uint)bVar1 * 2 + ((uint)bVar1 + (uint)bVar1 * 8) * 3 +
                            (uint)pixels[1] * 0x96 + (uint)*pixels * 0x4d >> 8);
          pixels = pixels + 3;
          pfVar6 = pfVar6 + 1;
          uVar12 = uVar12 - 1;
        } while (1 < uVar12);
      }
      pixels = pixels + iVar11;
      iVar19 = iVar19 + 1;
    } while (iVar19 != h);
    return __return_storage_ptr__;
  case 0x30002:
    create(__return_storage_ptr__,w,h,1,4,allocator);
    pfVar6 = (float *)__return_storage_ptr__->data;
    if (pfVar6 == (float *)0x0) {
      return __return_storage_ptr__;
    }
    if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
      return __return_storage_ptr__;
    }
    iVar11 = stride + w * -3;
    iVar22 = 1;
    if (iVar11 == 0) {
      iVar22 = h;
      h = 1;
    }
    if (h < 1) {
      return __return_storage_ptr__;
    }
    iVar19 = 0;
    do {
      uVar12 = iVar22 * w + 1;
      if (0 < iVar22 * w) {
        do {
          bVar1 = *pixels;
          *pfVar6 = (float)((uint)bVar1 * 2 + ((uint)bVar1 + (uint)bVar1 * 8) * 3 +
                            (uint)pixels[1] * 0x96 + (uint)pixels[2] * 0x4d >> 8);
          pixels = pixels + 3;
          pfVar6 = pfVar6 + 1;
          uVar12 = uVar12 - 1;
        } while (1 < uVar12);
      }
      pixels = pixels + iVar11;
      iVar19 = iVar19 + 1;
    } while (iVar19 != h);
    return __return_storage_ptr__;
  case 0x30003:
    return __return_storage_ptr__;
  case 0x30004:
    create(__return_storage_ptr__,w,h,1,4,allocator);
    pfVar6 = (float *)__return_storage_ptr__->data;
    if (pfVar6 == (float *)0x0) {
      return __return_storage_ptr__;
    }
    if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
      return __return_storage_ptr__;
    }
    iVar11 = stride + w * -4;
    iVar22 = 1;
    if (iVar11 == 0) {
      iVar22 = h;
      h = 1;
    }
    if (h < 1) {
      return __return_storage_ptr__;
    }
    iVar19 = 0;
    do {
      uVar12 = iVar22 * w + 1;
      if (0 < iVar22 * w) {
        do {
          bVar1 = pixels[2];
          *pfVar6 = (float)((uint)bVar1 * 2 + ((uint)bVar1 + (uint)bVar1 * 8) * 3 +
                            (uint)pixels[1] * 0x96 + (uint)*pixels * 0x4d >> 8);
          pixels = pixels + 4;
          pfVar6 = pfVar6 + 1;
          uVar12 = uVar12 - 1;
        } while (1 < uVar12);
      }
      pixels = pixels + iVar11;
      iVar19 = iVar19 + 1;
    } while (iVar19 != h);
    return __return_storage_ptr__;
  case 0x30005:
    create(__return_storage_ptr__,w,h,1,4,allocator);
    pfVar6 = (float *)__return_storage_ptr__->data;
    if (pfVar6 == (float *)0x0) {
      return __return_storage_ptr__;
    }
    if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
      return __return_storage_ptr__;
    }
    iVar11 = stride + w * -4;
    iVar22 = 1;
    if (iVar11 == 0) {
      iVar22 = h;
      h = 1;
    }
    if (h < 1) {
      return __return_storage_ptr__;
    }
    iVar19 = 0;
    do {
      uVar12 = iVar22 * w + 1;
      if (0 < iVar22 * w) {
        do {
          bVar1 = *pixels;
          *pfVar6 = (float)((uint)bVar1 * 2 + ((uint)bVar1 + (uint)bVar1 * 8) * 3 +
                            (uint)pixels[1] * 0x96 + (uint)pixels[2] * 0x4d >> 8);
          pixels = pixels + 4;
          pfVar6 = pfVar6 + 1;
          uVar12 = uVar12 - 1;
        } while (1 < uVar12);
      }
      pixels = pixels + iVar11;
      iVar19 = iVar19 + 1;
    } while (iVar19 != h);
    return __return_storage_ptr__;
  }
  switch(type) {
  case 0x40001:
switchD_00126605_caseD_50002:
    create(__return_storage_ptr__,w,h,4,4,allocator);
    local_70.data = __return_storage_ptr__->data;
    if (local_70.data == (void *)0x0) {
      return __return_storage_ptr__;
    }
    if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
      return __return_storage_ptr__;
    }
    local_70.w = __return_storage_ptr__->w;
    local_70.h = __return_storage_ptr__->h;
    local_70.elemsize = __return_storage_ptr__->elemsize;
    local_70.elempack = __return_storage_ptr__->elempack;
    local_70.allocator = __return_storage_ptr__->allocator;
    local_70.refcount = (int *)0x0;
    local_70.dims = 3;
    local_70.c = 3;
    local_70.cstep =
         ((long)(local_70.h * local_70.w) * local_70.elemsize + 0xf & 0xfffffffffffffff0) /
         local_70.elemsize;
    from_rgb(pixels,w,h,stride,&local_70,allocator);
    auVar4 = _DAT_00183cf0;
    auVar3 = _DAT_00183ce0;
    auVar2 = _DAT_00183cd0;
    uVar12 = __return_storage_ptr__->h * __return_storage_ptr__->w;
    if (0 < (int)uVar12) {
      pvVar5 = __return_storage_ptr__->data;
      lVar7 = __return_storage_ptr__->cstep * __return_storage_ptr__->elemsize;
      lVar13 = (ulong)uVar12 - 1;
      auVar20._8_4_ = (int)lVar13;
      auVar20._0_8_ = lVar13;
      auVar20._12_4_ = (int)((ulong)lVar13 >> 0x20);
      uVar10 = 0;
      auVar20 = auVar20 ^ _DAT_00183cd0;
      do {
        auVar23._8_4_ = (int)uVar10;
        auVar23._0_8_ = uVar10;
        auVar23._12_4_ = (int)(uVar10 >> 0x20);
        auVar21 = (auVar23 | auVar4) ^ auVar2;
        iVar22 = auVar20._4_4_;
        if ((bool)(~(auVar21._4_4_ == iVar22 && auVar20._0_4_ < auVar21._0_4_ ||
                    iVar22 < auVar21._4_4_) & 1)) {
          *(undefined4 *)((long)pvVar5 + uVar10 * 4 + lVar7 * 3) = 0x437f0000;
        }
        if ((auVar21._12_4_ != auVar20._12_4_ || auVar21._8_4_ <= auVar20._8_4_) &&
            auVar21._12_4_ <= auVar20._12_4_) {
          *(undefined4 *)((long)pvVar5 + uVar10 * 4 + lVar7 * 3 + 4) = 0x437f0000;
        }
        auVar21 = (auVar23 | auVar3) ^ auVar2;
        iVar11 = auVar21._4_4_;
        if (iVar11 <= iVar22 && (iVar11 != iVar22 || auVar21._0_4_ <= auVar20._0_4_)) {
          *(undefined4 *)((long)pvVar5 + uVar10 * 4 + lVar7 * 3 + 8) = 0x437f0000;
          *(undefined4 *)((long)pvVar5 + uVar10 * 4 + lVar7 * 3 + 0xc) = 0x437f0000;
        }
        uVar10 = uVar10 + 4;
      } while ((uVar12 + 3 & 0xfffffffc) != uVar10);
    }
    if (local_70.refcount == (int *)0x0) {
      return __return_storage_ptr__;
    }
    LOCK();
    *local_70.refcount = *local_70.refcount + -1;
    UNLOCK();
    if (*local_70.refcount != 0) {
      return __return_storage_ptr__;
    }
    if (local_70.allocator != (Allocator *)0x0) {
      (**(code **)(*(long *)local_70.allocator + 0x18))();
      return __return_storage_ptr__;
    }
    break;
  case 0x40002:
switchD_00126605_caseD_50001:
    create(__return_storage_ptr__,w,h,4,4,allocator);
    local_70.data = __return_storage_ptr__->data;
    if (local_70.data == (void *)0x0) {
      return __return_storage_ptr__;
    }
    if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
      return __return_storage_ptr__;
    }
    local_70.w = __return_storage_ptr__->w;
    local_70.h = __return_storage_ptr__->h;
    local_70.elemsize = __return_storage_ptr__->elemsize;
    local_70.elempack = __return_storage_ptr__->elempack;
    local_70.allocator = __return_storage_ptr__->allocator;
    local_70.refcount = (int *)0x0;
    local_70.dims = 3;
    local_70.c = 3;
    local_70.cstep =
         ((long)(local_70.h * local_70.w) * local_70.elemsize + 0xf & 0xfffffffffffffff0) /
         local_70.elemsize;
    from_rgb2bgr(pixels,w,h,stride,&local_70,allocator);
    auVar4 = _DAT_00183cf0;
    auVar3 = _DAT_00183ce0;
    auVar2 = _DAT_00183cd0;
    uVar12 = __return_storage_ptr__->h * __return_storage_ptr__->w;
    if (0 < (int)uVar12) {
      pvVar5 = __return_storage_ptr__->data;
      lVar7 = __return_storage_ptr__->cstep * __return_storage_ptr__->elemsize;
      lVar13 = (ulong)uVar12 - 1;
      auVar26._8_4_ = (int)lVar13;
      auVar26._0_8_ = lVar13;
      auVar26._12_4_ = (int)((ulong)lVar13 >> 0x20);
      uVar10 = 0;
      auVar26 = auVar26 ^ _DAT_00183cd0;
      do {
        auVar25._8_4_ = (int)uVar10;
        auVar25._0_8_ = uVar10;
        auVar25._12_4_ = (int)(uVar10 >> 0x20);
        auVar21 = (auVar25 | auVar4) ^ auVar2;
        iVar22 = auVar26._4_4_;
        if ((bool)(~(auVar21._4_4_ == iVar22 && auVar26._0_4_ < auVar21._0_4_ ||
                    iVar22 < auVar21._4_4_) & 1)) {
          *(undefined4 *)((long)pvVar5 + uVar10 * 4 + lVar7 * 3) = 0x437f0000;
        }
        if ((auVar21._12_4_ != auVar26._12_4_ || auVar21._8_4_ <= auVar26._8_4_) &&
            auVar21._12_4_ <= auVar26._12_4_) {
          *(undefined4 *)((long)pvVar5 + uVar10 * 4 + lVar7 * 3 + 4) = 0x437f0000;
        }
        auVar21 = (auVar25 | auVar3) ^ auVar2;
        iVar11 = auVar21._4_4_;
        if (iVar11 <= iVar22 && (iVar11 != iVar22 || auVar21._0_4_ <= auVar26._0_4_)) {
          *(undefined4 *)((long)pvVar5 + uVar10 * 4 + lVar7 * 3 + 8) = 0x437f0000;
          *(undefined4 *)((long)pvVar5 + uVar10 * 4 + lVar7 * 3 + 0xc) = 0x437f0000;
        }
        uVar10 = uVar10 + 4;
      } while ((uVar12 + 3 & 0xfffffffc) != uVar10);
    }
    if (local_70.refcount == (int *)0x0) {
      return __return_storage_ptr__;
    }
    LOCK();
    *local_70.refcount = *local_70.refcount + -1;
    UNLOCK();
    if (*local_70.refcount != 0) {
      return __return_storage_ptr__;
    }
    if (local_70.allocator != (Allocator *)0x0) {
      (**(code **)(*(long *)local_70.allocator + 0x18))();
      return __return_storage_ptr__;
    }
    break;
  case 0x40003:
switchD_00126605_caseD_50003:
    create(__return_storage_ptr__,w,h,4,4,allocator);
    local_70.data = __return_storage_ptr__->data;
    if (local_70.data == (void *)0x0) {
      return __return_storage_ptr__;
    }
    if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
      return __return_storage_ptr__;
    }
    local_70.w = __return_storage_ptr__->w;
    local_70.h = __return_storage_ptr__->h;
    local_70.elemsize = __return_storage_ptr__->elemsize;
    local_70.elempack = __return_storage_ptr__->elempack;
    local_70.allocator = __return_storage_ptr__->allocator;
    local_70.refcount = (int *)0x0;
    local_70.dims = 3;
    local_70.c = 3;
    local_70.cstep =
         ((long)(local_70.h * local_70.w) * local_70.elemsize + 0xf & 0xfffffffffffffff0) /
         local_70.elemsize;
    from_gray2rgb(pixels,w,h,stride,&local_70,allocator);
    auVar4 = _DAT_00183cf0;
    auVar3 = _DAT_00183ce0;
    auVar2 = _DAT_00183cd0;
    uVar12 = __return_storage_ptr__->h * __return_storage_ptr__->w;
    if (0 < (int)uVar12) {
      pvVar5 = __return_storage_ptr__->data;
      lVar7 = __return_storage_ptr__->cstep * __return_storage_ptr__->elemsize;
      lVar13 = (ulong)uVar12 - 1;
      auVar21._8_4_ = (int)lVar13;
      auVar21._0_8_ = lVar13;
      auVar21._12_4_ = (int)((ulong)lVar13 >> 0x20);
      uVar10 = 0;
      auVar21 = auVar21 ^ _DAT_00183cd0;
      do {
        auVar24._8_4_ = (int)uVar10;
        auVar24._0_8_ = uVar10;
        auVar24._12_4_ = (int)(uVar10 >> 0x20);
        auVar26 = (auVar24 | auVar4) ^ auVar2;
        iVar22 = auVar21._4_4_;
        if ((bool)(~(auVar26._4_4_ == iVar22 && auVar21._0_4_ < auVar26._0_4_ ||
                    iVar22 < auVar26._4_4_) & 1)) {
          *(undefined4 *)((long)pvVar5 + uVar10 * 4 + lVar7 * 3) = 0x437f0000;
        }
        if ((auVar26._12_4_ != auVar21._12_4_ || auVar26._8_4_ <= auVar21._8_4_) &&
            auVar26._12_4_ <= auVar21._12_4_) {
          *(undefined4 *)((long)pvVar5 + uVar10 * 4 + lVar7 * 3 + 4) = 0x437f0000;
        }
        auVar24 = (auVar24 | auVar3) ^ auVar2;
        iVar11 = auVar24._4_4_;
        if (iVar11 <= iVar22 && (iVar11 != iVar22 || auVar24._0_4_ <= auVar21._0_4_)) {
          *(undefined4 *)((long)pvVar5 + uVar10 * 4 + lVar7 * 3 + 8) = 0x437f0000;
          *(undefined4 *)((long)pvVar5 + uVar10 * 4 + lVar7 * 3 + 0xc) = 0x437f0000;
        }
        uVar10 = uVar10 + 4;
      } while ((uVar12 + 3 & 0xfffffffc) != uVar10);
    }
    if (local_70.refcount == (int *)0x0) {
      return __return_storage_ptr__;
    }
    LOCK();
    *local_70.refcount = *local_70.refcount + -1;
    UNLOCK();
    if (*local_70.refcount != 0) {
      return __return_storage_ptr__;
    }
    if (local_70.allocator != (Allocator *)0x0) {
      (**(code **)(*(long *)local_70.allocator + 0x18))();
      return __return_storage_ptr__;
    }
    break;
  case 0x40004:
    return __return_storage_ptr__;
  case 0x40005:
switchD_00126605_caseD_50004:
    create(__return_storage_ptr__,w,h,4,4,allocator);
    pvVar5 = __return_storage_ptr__->data;
    if (pvVar5 == (void *)0x0) {
      return __return_storage_ptr__;
    }
    if ((long)__return_storage_ptr__->c * __return_storage_ptr__->cstep == 0) {
      return __return_storage_ptr__;
    }
    iVar11 = stride + w * -4;
    iVar22 = 1;
    if (iVar11 == 0) {
      iVar22 = h;
      h = 1;
    }
    if (h < 1) {
      return __return_storage_ptr__;
    }
    lVar7 = __return_storage_ptr__->cstep * __return_storage_ptr__->elemsize;
    pvVar16 = (void *)(lVar7 * 3 + (long)pvVar5);
    pvVar17 = (void *)((long)pvVar5 + lVar7 * 2);
    pvVar9 = (void *)(lVar7 + (long)pvVar5);
    iVar19 = 0;
    do {
      if (0 < iVar22 * w) {
        lVar7 = 0;
        uVar12 = iVar22 * w + 1;
        do {
          *(float *)((long)pvVar5 + lVar7) = (float)pixels[lVar7 + 2];
          *(float *)((long)pvVar9 + lVar7) = (float)pixels[lVar7 + 1];
          *(float *)((long)pvVar17 + lVar7) = (float)pixels[lVar7];
          *(float *)((long)pvVar16 + lVar7) = (float)pixels[lVar7 + 3];
          uVar12 = uVar12 - 1;
          lVar7 = lVar7 + 4;
        } while (1 < uVar12);
        pvVar16 = (void *)((long)pvVar16 + lVar7);
        pvVar17 = (void *)((long)pvVar17 + lVar7);
        pvVar9 = (void *)((long)pvVar9 + lVar7);
        pvVar5 = (void *)((long)pvVar5 + lVar7);
        pixels = pixels + lVar7;
      }
      pixels = pixels + iVar11;
      iVar19 = iVar19 + 1;
    } while (iVar19 != h);
    return __return_storage_ptr__;
  default:
    switch(type) {
    case 0x50001:
      goto switchD_00126605_caseD_50001;
    case 0x50002:
      goto switchD_00126605_caseD_50002;
    case 0x50003:
      goto switchD_00126605_caseD_50003;
    case 0x50004:
      goto switchD_00126605_caseD_50004;
    default:
      return __return_storage_ptr__;
    }
  }
  if (local_70.data != (void *)0x0) {
    free(local_70.data);
  }
  return __return_storage_ptr__;
}

Assistant:

Mat Mat::from_pixels(const unsigned char* pixels, int type, int w, int h, int stride, Allocator* allocator)
{
    Mat m;

    if (type & PIXEL_CONVERT_MASK)
    {
        switch (type)
        {
        case PIXEL_RGB2BGR:
        case PIXEL_BGR2RGB:
            from_rgb2bgr(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGB2GRAY:
            from_rgb2gray(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGB2RGBA:
        case PIXEL_BGR2BGRA:
            from_rgb2rgba(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_BGR2GRAY:
            from_bgr2gray(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_BGR2RGBA:
        case PIXEL_RGB2BGRA:
            from_bgr2rgba(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_GRAY2RGB:
        case PIXEL_GRAY2BGR:
            from_gray2rgb(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_GRAY2RGBA:
        case PIXEL_GRAY2BGRA:
            from_gray2rgba(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGBA2RGB:
        case PIXEL_BGRA2BGR:
            from_rgba2rgb(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGBA2BGR:
        case PIXEL_BGRA2RGB:
            from_rgba2bgr(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGBA2GRAY:
            from_rgba2gray(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_RGBA2BGRA:
        case PIXEL_BGRA2RGBA:
            from_rgba2bgra(pixels, w, h, stride, m, allocator);
            break;
        case PIXEL_BGRA2GRAY:
            from_bgra2gray(pixels, w, h, stride, m, allocator);
            break;
        default:
            // unimplemented convert type
            break;
        }
    }
    else
    {
        if (type == PIXEL_RGB || type == PIXEL_BGR)
            from_rgb(pixels, w, h, stride, m, allocator);

        if (type == PIXEL_GRAY)
            from_gray(pixels, w, h, stride, m, allocator);

        if (type == PIXEL_RGBA || type == PIXEL_BGRA)
            from_rgba(pixels, w, h, stride, m, allocator);
    }

    return m;
}